

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo_Location *this,uint8 *target,EpsCopyOutputStream *stream)

{
  string *s;
  size_t __n;
  void *pvVar1;
  bool bVar2;
  byte *in_RAX;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *local_38;
  
  uVar3 = (this->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  local_38 = in_RAX;
  if (0 < (int)uVar3) {
    local_38 = target;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    *local_38 = 10;
    local_38 = local_38 + 2;
    for (; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      local_38[-1] = (byte)uVar3 | 0x80;
      local_38 = local_38 + 1;
    }
    local_38[-1] = (byte)uVar3;
    puVar6 = (uint *)(this->path_).arena_or_elements_;
    puVar4 = puVar6 + (this->path_).current_size_;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
      uVar3 = *puVar6;
      if ((ulong)(long)(int)uVar3 < 0x80) {
        *local_38 = (byte)uVar3;
        target = local_38 + 1;
      }
      else {
        *local_38 = (byte)uVar3 | 0x80;
        uVar5 = (ulong)(long)(int)uVar3 >> 7;
        if (uVar3 < 0x4000) {
          local_38[1] = (byte)uVar5;
          target = local_38 + 2;
        }
        else {
          target = local_38 + 2;
          do {
            pbVar8 = target;
            pbVar8[-1] = (byte)uVar5 | 0x80;
            uVar7 = uVar5 >> 7;
            target = pbVar8 + 1;
            bVar2 = 0x3fff < uVar5;
            uVar5 = uVar7;
          } while (bVar2);
          *pbVar8 = (byte)uVar7;
        }
      }
      puVar6 = puVar6 + 1;
      local_38 = target;
    } while (puVar6 < puVar4);
  }
  uVar3 = (this->_span_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar3) {
    local_38 = target;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    *local_38 = 0x12;
    local_38 = local_38 + 2;
    for (; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      local_38[-1] = (byte)uVar3 | 0x80;
      local_38 = local_38 + 1;
    }
    local_38[-1] = (byte)uVar3;
    puVar6 = (uint *)(this->span_).arena_or_elements_;
    puVar4 = puVar6 + (this->span_).current_size_;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
      uVar3 = *puVar6;
      if ((ulong)(long)(int)uVar3 < 0x80) {
        *local_38 = (byte)uVar3;
        target = local_38 + 1;
      }
      else {
        *local_38 = (byte)uVar3 | 0x80;
        uVar5 = (ulong)(long)(int)uVar3 >> 7;
        if (uVar3 < 0x4000) {
          local_38[1] = (byte)uVar5;
          target = local_38 + 2;
        }
        else {
          target = local_38 + 2;
          do {
            pbVar8 = target;
            pbVar8[-1] = (byte)uVar5 | 0x80;
            uVar7 = uVar5 >> 7;
            target = pbVar8 + 1;
            bVar2 = 0x3fff < uVar5;
            uVar5 = uVar7;
          } while (bVar2);
          *pbVar8 = (byte)uVar7;
        }
      }
      puVar6 = puVar6 + 1;
      local_38 = target;
    } while (puVar6 < puVar4);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,(this->leading_comments_).ptr_,target);
  }
  if ((uVar3 & 2) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,4,(this->trailing_comments_).ptr_,target);
  }
  uVar3 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = 0;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar7 = 0;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    s = (string *)
        ((this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_)->elements[uVar5];
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = 0x32;
      target[1] = (byte)__n;
      memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,6,s,target);
    }
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    target = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target,stream);
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  // repeated int32 span = 2 [packed = true];
  {
    int byte_size = _span_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, _internal_span(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string leading_comments = 3;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_leading_comments().data(), static_cast<int>(this->_internal_leading_comments().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_leading_comments(), target);
  }

  // optional string trailing_comments = 4;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_trailing_comments().data(), static_cast<int>(this->_internal_trailing_comments().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_trailing_comments(), target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this->_internal_leading_detached_comments_size(); i < n; i++) {
    const auto& s = this->_internal_leading_detached_comments(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = stream->WriteString(6, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}